

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

int Nwk_ObjDeref_rec(Nwk_Obj_t *pNode)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Nwk_Obj_t *pFanin;
  Nwk_Obj_t *pNode_local;
  
  local_28 = 1;
  iVar1 = Nwk_ObjIsCi(pNode);
  if (iVar1 == 0) {
    local_24 = 0;
    while( true ) {
      bVar2 = false;
      if (local_24 < pNode->nFanins) {
        _Counter = pNode->pFanio[local_24];
        bVar2 = _Counter != (Nwk_Obj_t *)0x0;
      }
      if (!bVar2) break;
      if (_Counter->nFanouts < 1) {
        __assert_fail("pFanin->nFanouts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkDfs.c"
                      ,0x23c,"int Nwk_ObjDeref_rec(Nwk_Obj_t *)");
      }
      iVar1 = _Counter->nFanouts + -1;
      _Counter->nFanouts = iVar1;
      if (iVar1 == 0) {
        iVar1 = Nwk_ObjDeref_rec(_Counter);
        local_28 = iVar1 + local_28;
      }
      local_24 = local_24 + 1;
    }
    pNode_local._4_4_ = local_28;
  }
  else {
    pNode_local._4_4_ = 0;
  }
  return pNode_local._4_4_;
}

Assistant:

int Nwk_ObjDeref_rec( Nwk_Obj_t * pNode )
{
    Nwk_Obj_t * pFanin;
    int i, Counter = 1;
    if ( Nwk_ObjIsCi(pNode) )
        return 0;
    Nwk_ObjForEachFanin( pNode, pFanin, i )
    {
        assert( pFanin->nFanouts > 0 );
        if ( --pFanin->nFanouts == 0 )
            Counter += Nwk_ObjDeref_rec( pFanin );
    }
    return Counter;
}